

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O0

void room_update(void)

{
  short *psVar1;
  ROOM_INDEX_DATA *pRVar2;
  ROOM_AFFECT_DATA *pRVar3;
  ROOM_AFFECT_DATA *paf_next;
  ROOM_AFFECT_DATA *paf;
  ROOM_INDEX_DATA *room_next;
  ROOM_INDEX_DATA *room;
  ROOM_AFFECT_DATA *in_stack_00000028;
  ROOM_INDEX_DATA *in_stack_00000030;
  ROOM_AFFECT_DATA *local_18;
  ROOM_INDEX_DATA *local_8;
  
  local_8 = top_affected_room;
  pRVar2 = local_8;
  while (local_8 = pRVar2, local_8 != (ROOM_INDEX_DATA *)0x0) {
    pRVar2 = local_8->aff_next;
    local_18 = local_8->affected;
    while (local_18 != (ROOM_AFFECT_DATA *)0x0) {
      pRVar3 = local_18->next;
      if ((local_18->duration != 0) && (local_18->tick_fun != (RAFF_FUN *)0x0)) {
        (*local_18->tick_fun)(local_8,local_18);
      }
      if (local_18->duration < 1) {
        psVar1 = &local_18->duration;
        local_18 = pRVar3;
        if (-1 < *psVar1) {
          affect_remove_room(in_stack_00000030,in_stack_00000028);
        }
      }
      else {
        local_18->duration = local_18->duration + -1;
        local_18 = pRVar3;
      }
    }
  }
  return;
}

Assistant:

void room_update(void)
{
	ROOM_INDEX_DATA *room;
	ROOM_INDEX_DATA *room_next;

	for (room = top_affected_room; room; room = room_next)
	{
		ROOM_AFFECT_DATA *paf;
		ROOM_AFFECT_DATA *paf_next;

		room_next = room->aff_next;

		for (paf = room->affected; paf != nullptr; paf = paf_next)
		{
			paf_next = paf->next;

			if (paf->duration != 0)
			{
				if (paf->tick_fun)
					(*paf->tick_fun)(room, paf);
			}

			if (paf->duration > 0)
				paf->duration--;
			else if (paf->duration < 0); //TODO: possible logic error
			else
				affect_remove_room(room, paf);
		}
	}
}